

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-embed.c
# Opt level: O0

void embed_thread_runner(void *arg)

{
  int iVar1;
  undefined8 uVar2;
  int *piVar3;
  bool bVar4;
  undefined1 local_28 [8];
  epoll_event ev;
  int timeout;
  int fd;
  int r;
  void *arg_local;
  
  while (embed_closed == 0) {
    uVar2 = uv_default_loop();
    ev.data.u64._4_4_ = uv_backend_fd(uVar2);
    uVar2 = uv_default_loop();
    ev.data.fd = uv_backend_timeout(uVar2);
    do {
      iVar1 = epoll_wait(ev.data.u64._4_4_,(epoll_event *)local_28,1,ev.data.fd);
      bVar4 = false;
      if (iVar1 == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    uv_async_send(&embed_async);
    uv_sem_wait(&embed_sem);
  }
  return;
}

Assistant:

static void embed_thread_runner(void* arg) {
  int r;
  int fd;
  int timeout;

  while (!embed_closed) {
    fd = uv_backend_fd(uv_default_loop());
    timeout = uv_backend_timeout(uv_default_loop());

    do {
#if defined(HAVE_KQUEUE)
      struct timespec ts;
      ts.tv_sec = timeout / 1000;
      ts.tv_nsec = (timeout % 1000) * 1000000;
      r = kevent(fd, NULL, 0, NULL, 0, &ts);
#elif defined(HAVE_EPOLL)
      {
        struct epoll_event ev;
        r = epoll_wait(fd, &ev, 1, timeout);
      }
#endif
    } while (r == -1 && errno == EINTR);
    uv_async_send(&embed_async);
    uv_sem_wait(&embed_sem);
  }
}